

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O2

_Bool borg_happy_grid_bold(wchar_t y,wchar_t x)

{
  wchar_t y_00;
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  uint8_t uVar4;
  _Bool _Var5;
  ulong uVar6;
  ushort uVar7;
  bool bVar8;
  
  if (0xffffff3e < (uint)(x + L'\xffffff3c') && 0xffffffc2 < (uint)(y + L'\xffffffc0')) {
    uVar4 = borg_grids[y][x].feat;
    if ((byte)(uVar4 - 5) < 2) {
      return true;
    }
    if (borg_grids[y][x].glyph != false) {
      return true;
    }
    if ((((uVar4 != '\x17') || (borg.trait[0x40] != 0)) && (borg.trait[0x6c] == 0)) &&
       ((borg.trait[0x1a] != 0 && (borg_t - borg_began < 2000)))) {
      y_00 = y + L'\xffffffff';
      _Var5 = borg_cave_floor_bold(y_00,x);
      if (_Var5) {
        wVar3 = y + L'\x01';
        _Var5 = borg_cave_floor_bold(wVar3,x);
        if (_Var5) {
          wVar1 = x + L'\xffffffff';
          _Var5 = borg_cave_floor_bold(y,wVar1);
          if (!_Var5) {
            wVar2 = x + L'\x01';
            _Var5 = borg_cave_floor_bold(y,wVar2);
            if (((!_Var5) && (_Var5 = borg_cave_floor_bold(wVar3,wVar1), !_Var5)) &&
               ((_Var5 = borg_cave_floor_bold(wVar3,wVar2), !_Var5 &&
                ((_Var5 = borg_cave_floor_bold(y_00,wVar1), !_Var5 &&
                 (_Var5 = borg_cave_floor_bold(y_00,wVar2), !_Var5)))))) {
              return true;
            }
          }
        }
      }
      wVar3 = x + L'\xffffffff';
      _Var5 = borg_cave_floor_bold(y,wVar3);
      if (_Var5) {
        wVar1 = x + L'\x01';
        _Var5 = borg_cave_floor_bold(y,wVar1);
        if ((_Var5) && (_Var5 = borg_cave_floor_bold(y_00,x), !_Var5)) {
          wVar2 = y + L'\x01';
          _Var5 = borg_cave_floor_bold(wVar2,x);
          if ((!_Var5) &&
             ((((_Var5 = borg_cave_floor_bold(wVar2,wVar3), !_Var5 &&
                (_Var5 = borg_cave_floor_bold(wVar2,wVar1), !_Var5)) &&
               (_Var5 = borg_cave_floor_bold(y_00,wVar3), !_Var5)) &&
              (_Var5 = borg_cave_floor_bold(y_00,wVar1), !_Var5)))) {
            return true;
          }
        }
      }
      _Var5 = borg_cave_floor_bold(y_00,x);
      if (((_Var5) && (_Var5 = borg_cave_floor_bold(y + L'\x01',x), _Var5)) &&
         ((_Var5 = borg_cave_floor_bold(y,wVar3), !_Var5 &&
          (_Var5 = borg_cave_floor_bold(y,x + L'\x01'), !_Var5)))) {
        return true;
      }
      _Var5 = borg_cave_floor_bold(y,wVar3);
      if (((_Var5) && (_Var5 = borg_cave_floor_bold(y,x + L'\x01'), _Var5)) &&
         ((_Var5 = borg_cave_floor_bold(y_00,x), !_Var5 &&
          (_Var5 = borg_cave_floor_bold(y + L'\x01',x), !_Var5)))) {
        return true;
      }
      _Var5 = borg_cave_floor_bold(y_00,x);
      if ((((!_Var5) && (_Var5 = borg_cave_floor_bold(y_00,wVar3), _Var5)) &&
          (_Var5 = borg_cave_floor_bold(y_00,x + L'\x01'), _Var5)) &&
         (_Var5 = borg_cave_floor_bold(y + L'\xfffffffe',x), _Var5)) {
        return true;
      }
      wVar1 = y + L'\x01';
      _Var5 = borg_cave_floor_bold(wVar1,x);
      if (((!_Var5) && (_Var5 = borg_cave_floor_bold(wVar1,wVar3), _Var5)) &&
         ((_Var5 = borg_cave_floor_bold(wVar1,x + L'\x01'), _Var5 &&
          (_Var5 = borg_cave_floor_bold(y + L'\x02',x), _Var5)))) {
        return true;
      }
      wVar2 = x + L'\x01';
      _Var5 = borg_cave_floor_bold(y,wVar2);
      if (((!_Var5) && (_Var5 = borg_cave_floor_bold(y_00,wVar2), _Var5)) &&
         ((_Var5 = borg_cave_floor_bold(wVar1,wVar2), _Var5 &&
          (_Var5 = borg_cave_floor_bold(y,x + L'\x02'), _Var5)))) {
        return true;
      }
      _Var5 = borg_cave_floor_bold(y,wVar3);
      if ((((!_Var5) && (_Var5 = borg_cave_floor_bold(y_00,wVar3), _Var5)) &&
          (_Var5 = borg_cave_floor_bold(wVar1,wVar3), _Var5)) &&
         (_Var5 = borg_cave_floor_bold(y,x + L'\xfffffffe'), _Var5)) {
        return true;
      }
      uVar6 = 0;
      uVar7 = track_step.num;
      if ((short)uVar7 < 1) {
        uVar7 = 0;
      }
      while( true ) {
        bVar8 = uVar7 != uVar6;
        if (!bVar8) {
          return bVar8;
        }
        if (((track_step.y[uVar6] == y) && (uVar6 < 0x19)) && (track_step.x[uVar6] == x)) break;
        uVar6 = uVar6 + 1;
      }
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool borg_happy_grid_bold(int y, int x)
{
    int i;

    borg_grid *ag = &borg_grids[y][x];

    /* Bounds Check */
    if (y >= DUNGEON_HGT - 2 || y <= 2 || x >= DUNGEON_WID - 2 || x <= 2)
        return false;

    /* Accept stairs */
    if (ag->feat == FEAT_LESS)
        return true;
    if (ag->feat == FEAT_MORE)
        return true;
    if (ag->glyph)
        return true;
    if (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
        return false;

    /* Hack -- weak/dark is very unhappy */
    if (borg.trait[BI_ISWEAK] || borg.trait[BI_LIGHT] == 0)
        return false;

    /* Apply a control effect so that he does not get stuck in a loop */
    if ((borg_t - borg_began) >= 2000)
        return false;

    /* Case 1a: north-south corridor */
    if (borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y, x - 1) && !borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y + 1, x - 1)
        && !borg_cave_floor_bold(y + 1, x + 1)
        && !borg_cave_floor_bold(y - 1, x - 1)
        && !borg_cave_floor_bold(y - 1, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1b: east-west corridor */
    if (borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y - 1, x) && !borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y + 1, x - 1)
        && !borg_cave_floor_bold(y + 1, x + 1)
        && !borg_cave_floor_bold(y - 1, x - 1)
        && !borg_cave_floor_bold(y - 1, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1aa: north-south doorway */
    if (borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y, x - 1) && !borg_cave_floor_bold(y, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1ba: east-west doorway */
    if (borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y - 1, x) && !borg_cave_floor_bold(y + 1, x)) {
        /* Happy */
        return true;
    }

    /* Case 2a: north pillar */
    if (!borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y - 1, x - 1)
        && borg_cave_floor_bold(y - 1, x + 1)
        && borg_cave_floor_bold(y - 2, x)) {
        /* Happy */
        return true;
    }

    /* Case 2b: south pillar */
    if (!borg_cave_floor_bold(y + 1, x) && borg_cave_floor_bold(y + 1, x - 1)
        && borg_cave_floor_bold(y + 1, x + 1)
        && borg_cave_floor_bold(y + 2, x)) {
        /* Happy */
        return true;
    }

    /* Case 2c: east pillar */
    if (!borg_cave_floor_bold(y, x + 1) && borg_cave_floor_bold(y - 1, x + 1)
        && borg_cave_floor_bold(y + 1, x + 1)
        && borg_cave_floor_bold(y, x + 2)) {
        /* Happy */
        return true;
    }

    /* Case 2d: west pillar */
    if (!borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y - 1, x - 1)
        && borg_cave_floor_bold(y + 1, x - 1)
        && borg_cave_floor_bold(y, x - 2)) {
        /* Happy */
        return true;
    }

    /* check for grids that have been stepped on before */
    for (i = 0; i < track_step.num; i++) {
        /* Enqueue the grid */
        if ((track_step.y[i] == y) && (track_step.x[i] == x)) {
            /* Recent step is good */
            if (i < 25) {
                return true;
            }
        }
    }

    /* Not happy */
    return false;
}